

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

uchar * mg_parse_dns_resource_record(uchar *data,uchar *end,mg_dns_resource_record *rr,int reply)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  uchar *name;
  byte *pbVar5;
  
  pbVar5 = data;
  if (data < end) {
    do {
      bVar1 = *pbVar5;
      if ((ulong)bVar1 == 0) break;
      if (0x3f < bVar1) {
        pbVar5 = pbVar5 + 1;
        break;
      }
      pbVar5 = pbVar5 + (ulong)bVar1 + 1;
    } while (pbVar5 < end);
  }
  (rr->name).p = (char *)data;
  (rr->name).len = (size_t)(pbVar5 + (1 - (long)data));
  pbVar4 = pbVar5 + 1;
  if (pbVar4 <= end + -4) {
    rr->rtype = (uint)(ushort)(*(ushort *)(pbVar5 + 1) << 8 | *(ushort *)(pbVar5 + 1) >> 8);
    pbVar4 = pbVar5 + 5;
    rr->rclass = (uint)(ushort)(*(ushort *)(pbVar5 + 3) << 8 | *(ushort *)(pbVar5 + 3) >> 8);
    rr->kind = (reply != 0) + MG_DNS_QUESTION;
    if ((reply != 0) && (pbVar4 < end + -6)) {
      uVar2 = *(uint *)(pbVar5 + 5);
      rr->ttl = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar3 = (ulong)(ushort)(*(ushort *)(pbVar5 + 9) << 8 | *(ushort *)(pbVar5 + 9) >> 8);
      (rr->rdata).p = (char *)(pbVar5 + 0xb);
      (rr->rdata).len = uVar3;
      pbVar4 = pbVar5 + uVar3 + 0xb;
    }
  }
  return pbVar4;
}

Assistant:

static unsigned char *mg_parse_dns_resource_record(
        unsigned char *data, unsigned char *end, struct mg_dns_resource_record *rr,
        int reply) {
    unsigned char *name = data;
    int chunk_len, data_len;

    while (data < end && (chunk_len = *data)) {
        if (((unsigned char *) data)[0] & 0xc0) {
            data += 1;
            break;
        }
        data += chunk_len + 1;
    }

    rr->name.p = (char *) name;
    rr->name.len = data - name + 1;

    data++;
    if (data > end - 4) {
        return data;
    }

    rr->rtype = data[0] << 8 | data[1];
    data += 2;

    rr->rclass = data[0] << 8 | data[1];
    data += 2;

    rr->kind = reply ? MG_DNS_ANSWER : MG_DNS_QUESTION;
    if (reply) {
        if (data >= end - 6) {
            return data;
        }

        rr->ttl = (uint32_t) data[0] << 24 | (uint32_t) data[1] << 16 |
                  data[2] << 8 | data[3];
        data += 4;

        data_len = *data << 8 | *(data + 1);
        data += 2;

        rr->rdata.p = (char *) data;
        rr->rdata.len = data_len;
        data += data_len;
    }
    return data;
}